

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall
ethash_params_init_genesis_check::test_method(ethash_params_init_genesis_check *this)

{
  uint64_t uVar1;
  long local_1c0;
  undefined1 local_1b8 [8];
  undefined8 local_1b0;
  shared_count sStack_1a8;
  undefined **local_1a0;
  undefined1 local_198;
  undefined8 *local_190;
  char *local_188;
  undefined **local_180;
  undefined1 local_178;
  undefined ***local_170;
  uint64_t *local_168;
  undefined **local_160;
  undefined1 local_158;
  undefined ***local_150;
  char *local_148;
  undefined **local_140;
  undefined1 local_138;
  undefined ***local_130;
  char *local_128;
  undefined **local_120;
  undefined1 local_118;
  undefined ***local_110;
  long *local_108;
  uint64_t local_100;
  uint64_t cache_size;
  uint64_t full_size;
  undefined4 local_e4;
  undefined **local_e0;
  undefined1 local_d8;
  undefined ***local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  uVar1 = ethash_get_datasize(0);
  full_size = uVar1;
  local_100 = ethash_get_cachesize(0);
  local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  cache_size = local_100;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xa0);
  local_1b8[0] = uVar1 < 0x40000000;
  local_1b0 = 0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_170 = &local_1a0;
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_0013aad8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "\nfull size: ";
  local_150 = &local_180;
  local_178 = 0;
  local_180 = &PTR__lazy_ostream_0013ab18;
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0013ab58;
  local_148 = "\n";
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_0013ab98;
  local_128 = "should be less than or equal to: ";
  local_108 = &local_1c0;
  local_1c0 = CONCAT44(local_1c0._4_4_,0x40000000);
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_0013abd8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0013ac18;
  local_c8 = "\n";
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_58 = "";
  local_168 = &full_size;
  local_130 = &local_160;
  local_110 = &local_140;
  local_d0 = &local_120;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  local_70 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0xa3);
  local_1b8[0] = full_size - 0x3ffff600 < 0xffffffffc0000000;
  local_1b0 = 0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_0013ac58;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "\nfull size + 20*MIX_BYTES: ";
  local_1c0 = full_size + 0xa00;
  local_178 = 0;
  local_180 = &PTR__lazy_ostream_0013ac98;
  local_170 = &local_1a0;
  local_168 = (uint64_t *)&local_1c0;
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0013acd8;
  local_150 = &local_180;
  local_148 = "\n";
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_0013ad18;
  local_128 = "should be greater than or equal to: ";
  local_108 = (long *)&local_e4;
  local_e4 = 0x40000000;
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_0013ad58;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0013ad98;
  local_c8 = "\n";
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_130 = &local_160;
  local_110 = &local_140;
  local_d0 = &local_120;
  boost::test_tools::tt_detail::report_assertion(local_1b8,&local_e0,&local_90,0xa3,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  local_a0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xa6);
  local_1b8[0] = local_100 < 0x2000000;
  local_1b0 = 0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_0013add8;
  local_190 = &boost::unit_test::lazy_ostream::inst;
  local_188 = "\ncache size: ";
  local_178 = 0;
  local_180 = &PTR__lazy_ostream_0013ae18;
  local_170 = &local_1a0;
  local_168 = &cache_size;
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_0013ae58;
  local_150 = &local_180;
  local_148 = "\n";
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_0013ae98;
  local_128 = "should be less than or equal to: ";
  local_1c0 = CONCAT44(local_1c0._4_4_,0x2000000);
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_0013aed8;
  local_108 = &local_1c0;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0013af18;
  local_c8 = "\n";
  local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_b8 = "";
  local_130 = &local_160;
  local_110 = &local_140;
  local_d0 = &local_120;
  boost::test_tools::tt_detail::report_assertion(local_1b8,&local_e0,&local_c0,0xa6,2,1,0);
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_params_init_genesis_check) {
	uint64_t full_size = ethash_get_datasize(0);
	uint64_t cache_size = ethash_get_cachesize(0);
	BOOST_REQUIRE_MESSAGE(full_size < ETHASH_DATASET_BYTES_INIT,
			"\nfull size: " << full_size << "\n"
					<< "should be less than or equal to: " << ETHASH_DATASET_BYTES_INIT << "\n");
	BOOST_REQUIRE_MESSAGE(full_size + 20 * ETHASH_MIX_BYTES >= ETHASH_DATASET_BYTES_INIT,
			"\nfull size + 20*MIX_BYTES: " << full_size + 20 * ETHASH_MIX_BYTES << "\n"
					<< "should be greater than or equal to: " << ETHASH_DATASET_BYTES_INIT << "\n");
	BOOST_REQUIRE_MESSAGE(cache_size < ETHASH_DATASET_BYTES_INIT / 32,
			"\ncache size: " << cache_size << "\n"
					<< "should be less than or equal to: " << ETHASH_DATASET_BYTES_INIT / 32 << "\n");
}